

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O0

Component ftxui::Menu(ConstStringListRef entries,int *selected,Ref<ftxui::MenuOption> *option)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *this;
  Component CVar1;
  ConstStringListRef local_40;
  Ref<ftxui::MenuOption> *option_local;
  int *selected_local;
  ConstStringListRef entries_local;
  
  selected_local = (int *)entries.ref_wide_;
  this = (element_type *)entries.ref_;
  option_local = option;
  entries_local.ref_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)selected;
  entries_local.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)this;
  Make<ftxui::MenuBase,ftxui::ConstStringListRef&,int*&,ftxui::Ref<ftxui::MenuOption>>
            (&local_40,&selected_local,(Ref<ftxui::MenuOption> *)&option_local);
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::MenuBase,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,(shared_ptr<ftxui::MenuBase> *)&local_40);
  std::shared_ptr<ftxui::MenuBase>::~shared_ptr((shared_ptr<ftxui::MenuBase> *)&local_40);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Menu(ConstStringListRef entries,
               int* selected,
               Ref<MenuOption> option) {
  return Make<MenuBase>(entries, selected, std::move(option));
}